

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O1

EntryType * __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::AllocateEntries(SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *this,int size,bool zeroAllocate)

{
  Recycler *this_00;
  EntryType *pEVar1;
  size_t byteSize;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])
             &(anonymous_namespace)::
              ValueEntry<bool,JsUtil::(anonymous_namespace)::ValueEntryData<bool>>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_2dab9b4;
  data.filename._0_4_ = 0x2d5;
  data.plusSize = (long)size;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_38);
  if (size == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pEVar1 = (EntryType *)&DAT_00000008;
  }
  else {
    byteSize = 0xffffffffffffffff;
    if (-1 < size) {
      byteSize = (long)size * 8;
    }
    pEVar1 = (EntryType *)new__<Memory::Recycler>(byteSize,this_00,0x7a34d8);
  }
  return pEVar1;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<Recycler, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, Recycler, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }